

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::FileIsDirectory(string *inName)

{
  ulong uVar1;
  int iVar2;
  char *__s1;
  size_t __n;
  bool bVar3;
  string string_buffer;
  stat fs;
  char local_buffer [4096];
  char *local_10d8;
  undefined8 local_10d0;
  char local_10c8;
  undefined7 uStack_10c7;
  stat local_10b8;
  char local_1028 [4104];
  
  uVar1 = inName->_M_string_length;
  if (uVar1 == 0) {
    bVar3 = false;
  }
  else {
    __s1 = (inName->_M_dataplus)._M_p;
    local_10d0 = 0;
    local_10c8 = '\0';
    __n = uVar1 - 1;
    local_10d8 = &local_10c8;
    if ((__n != 0) && ((__s1[__n] == '\\' || (__s1[__n] == '/')))) {
      iVar2 = strcmp(__s1,"/");
      if ((iVar2 != 0) && (__s1[uVar1 - 2] != ':')) {
        if (uVar1 < 0x1001) {
          memcpy(local_1028,__s1,__n);
          *(undefined1 *)((long)local_10b8.__unused + uVar1 + 0x17) = 0;
          __s1 = local_1028;
        }
        else {
          std::__cxx11::string::append((char *)&local_10d8,(ulong)__s1);
          __s1 = local_10d8;
        }
      }
    }
    iVar2 = stat(__s1,&local_10b8);
    bVar3 = (local_10b8.st_mode & 0xf000) == 0x4000 && iVar2 == 0;
    if (local_10d8 != &local_10c8) {
      operator_delete(local_10d8,CONCAT71(uStack_10c7,local_10c8) + 1);
    }
  }
  return bVar3;
}

Assistant:

static DWORD SystemToolsMakeRegistryMode(DWORD mode,
                                         SystemTools::KeyWOW64 view)
{
  // only add the modes when on a system that supports Wow64.
  static FARPROC wow64p =
    GetProcAddress(GetModuleHandleW(L"kernel32"), "IsWow64Process");
  if (wow64p == NULL) {
    return mode;
  }

  if (view == SystemTools::KeyWOW64_32) {
    return mode | KWSYS_ST_KEY_WOW64_32KEY;
  } else if (view == SystemTools::KeyWOW64_64) {
    return mode | KWSYS_ST_KEY_WOW64_64KEY;
  }
  return mode;
}